

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap3-gui.cpp
# Opt level: O3

void __thiscall TripleBuffer<stStateCore>::~TripleBuffer(TripleBuffer<stStateCore> *this)

{
  pointer psVar1;
  pointer piVar2;
  pointer pfVar3;
  
  std::
  _Rb_tree<int,_std::pair<const_int,_Cipher::Processor>,_std::_Select1st<std::pair<const_int,_Cipher::Processor>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Cipher::Processor>_>_>
  ::~_Rb_tree(&(this->out).processors._M_t);
  psVar1 = (this->out).keyPresses.
           super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
           super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (psVar1 != (pointer)0x0) {
    operator_delete(psVar1,(long)(this->out).keyPresses.
                                 super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                 .
                                 super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)psVar1);
  }
  std::
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  ::~vector(&(this->out).similarityMap);
  piVar2 = (this->out).params.cipher.hint.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)*(pointer *)
                                  ((long)&(this->out).params.cipher.hint.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data + 0x10) - (long)piVar2);
  }
  pfVar3 = (this->out).params.valuesFSpread.super__Vector_base<float,_std::allocator<float>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pfVar3 != (pointer)0x0) {
    operator_delete(pfVar3,(long)(this->out).params.valuesFSpread.
                                 super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pfVar3);
  }
  piVar2 = (this->out).params.valuesClusters.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->out).params.valuesClusters.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_Cipher::Processor>,_std::_Select1st<std::pair<const_int,_Cipher::Processor>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Cipher::Processor>_>_>
  ::~_Rb_tree(&(this->buffer).processors._M_t);
  psVar1 = (this->buffer).keyPresses.
           super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
           super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (psVar1 != (pointer)0x0) {
    operator_delete(psVar1,(long)(this->buffer).keyPresses.
                                 super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                 .
                                 super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)psVar1);
  }
  std::
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  ::~vector(&(this->buffer).similarityMap);
  piVar2 = (this->buffer).params.cipher.hint.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)*(pointer *)
                                  ((long)&(this->buffer).params.cipher.hint.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data + 0x10) - (long)piVar2);
  }
  pfVar3 = (this->buffer).params.valuesFSpread.super__Vector_base<float,_std::allocator<float>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pfVar3 != (pointer)0x0) {
    operator_delete(pfVar3,(long)(this->buffer).params.valuesFSpread.
                                 super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pfVar3);
  }
  piVar2 = (this->buffer).params.valuesClusters.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->buffer).params.valuesClusters.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_Cipher::Processor>,_std::_Select1st<std::pair<const_int,_Cipher::Processor>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Cipher::Processor>_>_>
  ::~_Rb_tree(&(this->super_stStateCore).processors._M_t);
  psVar1 = (this->super_stStateCore).keyPresses.
           super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
           super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (psVar1 != (pointer)0x0) {
    operator_delete(psVar1,(long)(this->super_stStateCore).keyPresses.
                                 super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                 .
                                 super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)psVar1);
  }
  std::
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  ::~vector(&(this->super_stStateCore).similarityMap);
  piVar2 = (this->super_stStateCore).params.cipher.hint.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)*(pointer *)
                                  ((long)&(this->super_stStateCore).params.cipher.hint.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data + 0x10) - (long)piVar2);
  }
  pfVar3 = (this->super_stStateCore).params.valuesFSpread.
           super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pfVar3 != (pointer)0x0) {
    operator_delete(pfVar3,(long)(this->super_stStateCore).params.valuesFSpread.
                                 super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pfVar3);
  }
  piVar2 = (this->super_stStateCore).params.valuesClusters.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->super_stStateCore).params.valuesClusters.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar2);
    return;
  }
  return;
}

Assistant:

bool update(bool force = false) {
        std::lock_guard<std::mutex> lock(mutex);
        hasChanged = true || force;
        this->flags.clear();

        return true;
    }